

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkP2PClientTest.cpp
# Opt level: O0

bool __thiscall MyClient::Initialize(MyClient *this)

{
  bool bVar1;
  undefined1 uVar2;
  long in_RDI;
  shared_ptr<MyClientConnection> connPtr;
  SDKJsonResult result;
  LogStringBuffer buffer;
  LogStringBuffer buffer_1;
  SDKJsonResult *in_stack_fffffffffffff8c8;
  undefined7 in_stack_fffffffffffff8d0;
  undefined1 in_stack_fffffffffffff8d7;
  MyClient **in_stack_fffffffffffff8f8;
  LogStringBuffer *in_stack_fffffffffffff908;
  Channel *buffer_00;
  undefined7 in_stack_fffffffffffff910;
  undefined1 in_stack_fffffffffffff917;
  string local_678 [39];
  allocator local_651;
  string local_650 [80];
  __shared_ptr<MyClientConnection,_(__gnu_cxx::_Lock_policy)2> local_600;
  undefined4 local_5ec;
  string local_5e8 [103];
  byte local_581;
  string *local_580;
  char *local_578;
  Channel *local_570;
  string *local_568;
  char *local_560;
  Channel *local_558;
  string *local_550;
  char *local_548;
  undefined4 local_53c;
  Channel *local_538;
  undefined4 local_52c;
  Channel *local_528;
  undefined1 local_510 [16];
  ostream aoStack_500 [376];
  string *local_388;
  char *local_380;
  undefined4 local_374;
  Channel *local_370;
  string *local_368;
  char *local_360;
  undefined8 local_358;
  undefined1 *local_350;
  Channel *local_348;
  undefined8 local_340;
  undefined1 *local_338;
  Channel *local_330;
  undefined8 local_328;
  undefined1 *local_320;
  string *local_318;
  char *local_310;
  undefined1 *local_308;
  Channel *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  Channel *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  string *local_2d0;
  undefined1 *local_2c8;
  Channel *local_2c0;
  string *local_2b8;
  undefined1 *local_2b0;
  string *local_2a8;
  char *local_2a0;
  undefined4 local_294;
  Channel *local_290;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  uint16_t in_stack_fffffffffffffd96;
  string *in_stack_fffffffffffffd98;
  SDKConnection *in_stack_fffffffffffffda0;
  SDKSocket *in_stack_fffffffffffffda8;
  SDKConnection *in_stack_ffffffffffffffa0;
  undefined1 *puVar3;
  
  *(undefined4 *)(in_RDI + 0x24) = 0;
  *(undefined4 *)(in_RDI + 0x28) = 10;
  *(undefined4 *)(in_RDI + 0x54) = 2;
  *(byte *)(in_RDI + 0x54) = *(byte *)(in_RDI + 0x54) | 4;
  *(undefined4 *)(in_RDI + 0x50) = 4000000;
  tonk::SDKSocket::Create
            ((SDKSocket *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  bVar1 = tonk::SDKResult::operator_cast_to_bool((SDKResult *)0x10b315);
  if (bVar1) {
    std::make_shared<MyClientConnection,MyClient*>(in_stack_fffffffffffff8f8);
    test::FunctionTimer::BeginCall
              ((FunctionTimer *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
    std::__shared_ptr<MyClientConnection,_(__gnu_cxx::_Lock_policy)2>::get(&local_600);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_650,"localhost",&local_651);
    tonk::SDKSocket::Connect
              (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
               in_stack_fffffffffffffd96);
    tonk::SDKJsonResult::operator=
              ((SDKJsonResult *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
               in_stack_fffffffffffff8c8);
    tonk::SDKJsonResult::~SDKJsonResult((SDKJsonResult *)0x10b7fe);
    std::__cxx11::string::~string(local_650);
    std::allocator<char>::~allocator((allocator<char> *)&local_651);
    test::FunctionTimer::EndCall
              ((FunctionTimer *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
    uVar2 = tonk::SDKResult::operator_cast_to_bool((SDKResult *)0x10b833);
    if ((bool)uVar2) {
      std::__shared_ptr<MyClientConnection,_(__gnu_cxx::_Lock_policy)2>::get(&local_600);
      test::SendPreconnectData(in_stack_ffffffffffffffa0);
    }
    else {
      tonk::SDKJsonResult::ToString_abi_cxx11_(in_stack_fffffffffffff8c8);
      local_558 = &Logger;
      local_560 = "Unable to connect: ";
      local_290 = &Logger;
      local_294 = 4;
      local_2a0 = "Unable to connect: ";
      buffer_00 = &Logger;
      local_568 = local_678;
      local_2a8 = local_678;
      if ((int)Logger.ChannelMinLevel < 5) {
        logger::LogStringBuffer::LogStringBuffer
                  ((LogStringBuffer *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
                   (char *)in_stack_fffffffffffff8c8,Trace);
        puVar3 = &stack0xfffffffffffffd98;
        std::operator<<((ostream *)&stack0xfffffffffffffda8,(string *)&Logger.Prefix);
        std::operator<<((ostream *)&stack0xfffffffffffffda8,"Unable to connect: ");
        std::operator<<((ostream *)(puVar3 + 0x10),local_678);
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write
                  ((OutputWorker *)CONCAT17(uVar2,in_stack_fffffffffffff910),
                   (LogStringBuffer *)buffer_00);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x10bba7);
      }
      std::__cxx11::string::~string(local_678);
    }
    local_581 = tonk::SDKResult::operator_cast_to_bool((SDKResult *)0x10bc7e);
    local_5ec = 1;
    std::shared_ptr<MyClientConnection>::~shared_ptr((shared_ptr<MyClientConnection> *)0x10bca9);
  }
  else {
    tonk::SDKJsonResult::ToString_abi_cxx11_(in_stack_fffffffffffff8c8);
    local_570 = &Logger;
    local_578 = "Unable to create socket: ";
    local_580 = local_5e8;
    local_538 = &Logger;
    local_53c = 4;
    local_548 = "Unable to create socket: ";
    local_528 = &Logger;
    local_52c = 4;
    local_550 = local_580;
    if ((int)Logger.ChannelMinLevel < 5) {
      local_370 = &Logger;
      local_374 = 4;
      local_380 = "Unable to create socket: ";
      local_388 = local_580;
      logger::LogStringBuffer::LogStringBuffer
                ((LogStringBuffer *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
                 (char *)in_stack_fffffffffffff8c8,Trace);
      local_358 = 0x12d358;
      local_348 = &Logger;
      local_350 = local_510;
      local_360 = local_380;
      local_368 = local_388;
      local_330 = &Logger;
      local_340 = local_358;
      local_338 = local_350;
      local_328 = local_358;
      local_320 = local_350;
      std::operator<<(aoStack_500,(string *)&Logger.Prefix);
      local_300 = &Logger;
      local_308 = local_350;
      local_310 = local_360;
      local_318 = local_368;
      local_2e8 = &Logger;
      local_2f0 = local_350;
      local_2f8 = local_360;
      local_2d8 = local_350;
      local_2e0 = local_360;
      std::operator<<((ostream *)(local_350 + 0x10),local_360);
      local_2c0 = &Logger;
      local_2c8 = local_308;
      local_2d0 = local_318;
      local_2b0 = local_308;
      local_2b8 = local_318;
      std::operator<<((ostream *)(local_308 + 0x10),local_318);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write
                ((OutputWorker *)CONCAT17(in_stack_fffffffffffff917,in_stack_fffffffffffff910),
                 in_stack_fffffffffffff908);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x10b6a6);
    }
    std::__cxx11::string::~string(local_5e8);
    local_581 = tonk::SDKResult::operator_cast_to_bool((SDKResult *)0x10b6c6);
    local_5ec = 1;
  }
  tonk::SDKJsonResult::~SDKJsonResult((SDKJsonResult *)0x10bcc7);
  return (bool)(local_581 & 1);
}

Assistant:

bool MyClient::Initialize()
{
    // Set configuration
    Config.UDPListenPort = 0;
    Config.MaximumClients = 10;
    Config.Flags = TONK_FLAGS_ENABLE_UPNP;
    Config.Flags |= TONK_FLAGS_DISABLE_COMPRESSION;
    Config.BandwidthLimitBPS = 4000000;

    tonk::SDKJsonResult result = Create();
    if (!result)
    {
        Logger.Error("Unable to create socket: ", result.ToString());
        return result;
    }

    auto connPtr = std::make_shared<MyClientConnection>(this);

    t_tonk_connect.BeginCall();
    result = Connect(
        connPtr.get(),
        TONK_TEST_SERVER_IP,
        kUDPServerPort_Client);
    t_tonk_connect.EndCall();

    if (!result) {
        Logger.Error("Unable to connect: ", result.ToString());
    }
    else {
        SendPreconnectData(connPtr.get());
    }

    return result;
}